

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkFromTruthTable(word *pTruth,int nVars)

{
  Mem_Flex_t *pMan;
  char *pSop;
  Abc_Ntk_t *pNtk;
  
  pMan = Mem_FlexStart();
  pSop = Abc_SopCreateFromTruth(pMan,nVars,(uint *)pTruth);
  pNtk = Abc_NtkCreateWithNode(pSop);
  Abc_NtkShortNames(pNtk);
  Mem_FlexStop(pMan,0);
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkFromTruthTable( word * pTruth, int nVars )
{
    Abc_Ntk_t * pNtk;
    Mem_Flex_t * pMan;
    char * pSopCover;

    pMan = Mem_FlexStart();
    pSopCover = Abc_SopCreateFromTruth( pMan, nVars, (unsigned*)pTruth );
    pNtk = Abc_NtkCreateWithNode( pSopCover );
    Abc_NtkShortNames( pNtk );
    Mem_FlexStop( pMan, 0 );

    return pNtk;
}